

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O3

void __thiscall cmRealDirectoryWatcher::~cmRealDirectoryWatcher(cmRealDirectoryWatcher *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher =
       (_func_int **)&PTR__cmRealDirectoryWatcher_006f4040;
  pcVar2 = (this->PathSegment)._M_dataplus._M_p;
  paVar1 = &(this->PathSegment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  cmVirtualDirectoryWatcher::~cmVirtualDirectoryWatcher(&this->super_cmVirtualDirectoryWatcher);
  return;
}

Assistant:

~cmRealDirectoryWatcher() override
  {
    // Handle is freed via uv_handle_close callback!
  }